

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadRaw(CodedInputStream *this,void *buffer,int size)

{
  bool bVar1;
  int amount;
  int size_local;
  void *buffer_local;
  CodedInputStream *this_local;
  int current_buffer_size;
  
  this_local._4_4_ = size;
  _current_buffer_size = buffer;
  do {
    amount = BufferSize(this);
    if (this_local._4_4_ <= amount) {
      memcpy(_current_buffer_size,this->buffer_,(long)this_local._4_4_);
      Advance(this,this_local._4_4_);
      return true;
    }
    memcpy(_current_buffer_size,this->buffer_,(long)amount);
    _current_buffer_size = (void *)((long)_current_buffer_size + (long)amount);
    this_local._4_4_ = this_local._4_4_ - amount;
    Advance(this,amount);
    bVar1 = Refresh(this);
  } while (bVar1);
  return false;
}

Assistant:

bool CodedInputStream::ReadRaw(void* buffer, int size) {
  return InternalReadRawInline(buffer, size);
}